

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platformplugin_posix.cpp
# Opt level: O0

shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(shared_ptr<Options> *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IPlatformPlugin> sVar1;
  shared_ptr<(anonymous_namespace)::PosixPlatformPlugin> local_28;
  shared_ptr<Options> *options_local;
  
  options_local = options;
  std::make_shared<(anonymous_namespace)::PosixPlatformPlugin,std::shared_ptr<Options>const&>
            ((shared_ptr<Options> *)&local_28);
  std::shared_ptr<IPlatformPlugin>::shared_ptr<(anonymous_namespace)::PosixPlatformPlugin,void>
            ((shared_ptr<IPlatformPlugin> *)options,&local_28);
  std::shared_ptr<(anonymous_namespace)::PosixPlatformPlugin>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IPlatformPlugin>)
         sVar1.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(const std::shared_ptr<Options>& options) {
    return std::make_shared<PosixPlatformPlugin>(options);
}